

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

HelicsBool helicsInputGetBoolean(HelicsInput inp,HelicsError *err)

{
  undefined8 in_RAX;
  HelicsInput pvVar1;
  uint uVar2;
  bool val;
  byte local_11;
  
  local_11 = (byte)((ulong)in_RAX >> 0x38);
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (inp == (HelicsInput)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a90c1;
    }
    else {
      pvVar1 = (HelicsInput)0x0;
      if (*inp == 0x3456e052) {
        pvVar1 = inp;
      }
      if (*inp == 0x3456e052 || err == (HelicsError *)0x0) goto LAB_001a90c3;
    }
    err->error_code = -3;
    err->message = "The given input object does not point to a valid object";
  }
LAB_001a90c1:
  pvVar1 = (HelicsInput)0x0;
LAB_001a90c3:
  uVar2 = 0;
  if (pvVar1 != (HelicsInput)0x0) {
    helics::Input::getValue_impl<bool>(*(Input **)((long)pvVar1 + 0x18),&local_11);
    uVar2 = (uint)local_11;
  }
  return uVar2;
}

Assistant:

HelicsBool helicsInputGetBoolean(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        const bool boolval = inpObj->inputPtr->getValue<bool>();
        return (boolval) ? HELICS_TRUE : HELICS_FALSE;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}